

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

void open_stream(char *name,FILE *fp)

{
  int iVar1;
  long lVar2;
  
  iVar1 = file_stack_ptr;
  lVar2 = (long)file_stack_ptr;
  if (lVar2 < 0x20) {
    file_stack[lVar2].fp = fp;
    file_stack[lVar2].lineno = 1;
    strncpy(file_stack[lVar2].filename,name,0xf7);
    file_stack[lVar2].filename[0xf7] = '\0';
    file_stack_ptr = iVar1 + 1;
  }
  return;
}

Assistant:

void
open_stream (const char *name, FILE *fp)
{
  InputFile *new = &file_stack[file_stack_ptr];

  if (file_stack_ptr >= MAX_INCLUDE_DEPTH)
    return;

  /* Add this file to the file input stack. */
  new->fp = fp;
  new->lineno = 1;
  strncpy (new->filename, name, MAX_FILENAME_LENGTH - 1);
  new->filename[MAX_FILENAME_LENGTH - 1] = '\0';
  file_stack_ptr++;
}